

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCompactProtocol.h
# Opt level: O2

shared_ptr<duckdb_apache::thrift::protocol::TProtocol> __thiscall
duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::DecryptionTransport>::getProtocol
          (TCompactProtocolFactoryT<duckdb::DecryptionTransport> *this,
          shared_ptr<duckdb_apache::thrift::transport::TTransport> *trans)

{
  __shared_ptr<duckdb::DecryptionTransport,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  TCompactProtocolT<duckdb::DecryptionTransport> *this_00;
  __shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> sVar2;
  shared_ptr<duckdb::DecryptionTransport> specific_trans;
  __shared_ptr<duckdb::DecryptionTransport,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<duckdb::DecryptionTransport,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<duckdb::DecryptionTransport,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::static_pointer_cast<duckdb::DecryptionTransport,duckdb_apache::thrift::transport::TTransport>
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)&local_58);
  if (local_58._M_ptr == (element_type *)0x0) {
    this_00 = (TCompactProtocolT<duckdb::DecryptionTransport> *)operator_new(0xb0);
    std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                  *)&local_48,in_RDX);
    TCompactProtocolT<duckdb_apache::thrift::transport::TTransport>::TCompactProtocolT
              ((TCompactProtocolT<duckdb_apache::thrift::transport::TTransport> *)this_00,
               (shared_ptr<duckdb_apache::thrift::transport::TTransport> *)&local_48,
               *(int32_t *)
                &(trans->
                 super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi,
               *(int32_t *)
                ((long)&(trans->
                        super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi + 4));
    p_Var1 = &local_48;
  }
  else {
    this_00 = (TCompactProtocolT<duckdb::DecryptionTransport> *)operator_new(0xb0);
    std::__shared_ptr<duckdb::DecryptionTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,&local_58);
    TCompactProtocolT<duckdb::DecryptionTransport>::TCompactProtocolT
              (this_00,(shared_ptr<duckdb::DecryptionTransport> *)&local_38,
               *(int32_t *)
                &(trans->
                 super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi,
               *(int32_t *)
                ((long)&(trans->
                        super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi + 4));
    p_Var1 = &local_38;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  std::__shared_ptr<duckdb_apache::thrift::protocol::TProtocol,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb_apache::thrift::protocol::TProtocol,void>
            ((__shared_ptr<duckdb_apache::thrift::protocol::TProtocol,(__gnu_cxx::_Lock_policy)2> *)
             this,(TProtocol *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  sVar2.super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<duckdb_apache::thrift::protocol::TProtocol>)
         sVar2.
         super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TProtocol> getProtocol(std::shared_ptr<TTransport> trans) override {
    std::shared_ptr<Transport_> specific_trans = std::static_pointer_cast<Transport_>(trans);
    TProtocol* prot;
    if (specific_trans) {
      prot = new TCompactProtocolT<Transport_>(specific_trans, string_limit_, container_limit_);
    } else {
      prot = new TCompactProtocol(trans, string_limit_, container_limit_);
    }

    return std::shared_ptr<TProtocol>(prot);
  }